

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O2

void handle_device_fd(int fd)

{
  char cVar1;
  listnode *__s2;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  __pid_t _Var7;
  ssize_t sVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  listnode *plVar14;
  undefined8 local_4e8;
  uint local_4e0;
  uint uid;
  undefined8 local_4d8;
  char *local_4d0;
  mode_t perm;
  int local_4c4;
  uevent uevent;
  char local_498 [96];
  char msg [1026];
  
  local_4c4 = fd;
  do {
    do {
      pcVar12 = msg;
      sVar8 = recv(fd,pcVar12,0x400,0);
      uVar3 = (uint)sVar8;
      if ((int)uVar3 < 1) {
        return;
      }
    } while (uVar3 == 0x400);
    msg[uVar3 & 0x7fffffff] = '\0';
    pcVar11 = "";
    uevent.action = "";
    uevent.path = "";
    uevent.subsystem = "";
    uevent.firmware = "";
    uevent.major = -1;
    uevent.minor = -1;
    msg[uVar3 + 1] = '\0';
    local_4d8 = 0xffffffff;
    local_4e8 = 0xffffffffffffffff;
    local_4d0 = "";
    pcVar10 = "";
    pcVar13 = "";
    while (*pcVar12 != '\0') {
      iVar4 = strncmp(pcVar12,"ACTION=",7);
      if (iVar4 == 0) {
        pcVar11 = pcVar12 + 7;
        pcVar12 = pcVar11;
        uevent.action = pcVar11;
      }
      else {
        iVar4 = strncmp(pcVar12,"DEVPATH=",8);
        if (iVar4 == 0) {
          pcVar13 = pcVar12 + 8;
          pcVar12 = pcVar13;
          uevent.path = pcVar13;
        }
        else {
          iVar4 = strncmp(pcVar12,"SUBSYSTEM=",10);
          if (iVar4 == 0) {
            pcVar10 = pcVar12 + 10;
            pcVar12 = pcVar10;
            uevent.subsystem = pcVar10;
          }
          else {
            iVar4 = strncmp(pcVar12,"FIRMWARE=",9);
            if (iVar4 == 0) {
              local_4d0 = pcVar12 + 9;
              pcVar12 = local_4d0;
              uevent.firmware = local_4d0;
            }
            else {
              iVar4 = strncmp(pcVar12,"MAJOR=",6);
              if (iVar4 == 0) {
                pcVar12 = pcVar12 + 6;
                iVar4 = atoi(pcVar12);
                local_4e8 = CONCAT44(extraout_var_00,iVar4);
                uevent.major = iVar4;
              }
              else {
                iVar4 = strncmp(pcVar12,"MINOR=",6);
                if (iVar4 == 0) {
                  pcVar12 = pcVar12 + 6;
                  iVar4 = atoi(pcVar12);
                  local_4d8 = CONCAT44(extraout_var,iVar4);
                  uevent.minor = iVar4;
                }
              }
            }
          }
        }
      }
      do {
        cVar1 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while (cVar1 != '\0');
    }
    log_write(6,"<6>init: event { \'%s\', \'%s\', \'%s\', \'%s\', %d, %d }\n",pcVar11,pcVar13,
              pcVar10,local_4d0,local_4e8,local_4d8);
    iVar4 = uevent.major;
    if (((-1 < uevent.major) && (iVar2 = uevent.minor, -1 < (long)uevent._32_8_)) &&
       (pcVar12 = strrchr(uevent.path,0x2f), pcVar12 != (char *)0x0)) {
      local_4d0 = pcVar12 + 1;
      sVar9 = strlen(local_4d0);
      pcVar10 = uevent.subsystem;
      if (sVar9 < 0x41) {
        iVar5 = strncmp(uevent.subsystem,"block",5);
        local_4d8 = CONCAT44(local_4d8._4_4_,iVar5);
        if (iVar5 == 0) {
          pcVar10 = "/dev/block/";
LAB_00107a32:
          mkdir(pcVar10,0x1ed);
        }
        else {
          iVar5 = strncmp(pcVar10,"graphics",8);
          if (iVar5 == 0) {
            pcVar10 = "/dev/graphics/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"oncrpc",6);
          if (iVar5 == 0) {
            pcVar10 = "/dev/oncrpc/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"adsp",4);
          if (iVar5 == 0) {
            pcVar10 = "/dev/adsp/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"msm_camera",10);
          if (iVar5 == 0) {
            pcVar10 = "/dev/msm_camera/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"input",5);
          if (iVar5 == 0) {
            pcVar10 = "/dev/input/";
            goto LAB_00107a32;
          }
          if (((*pcVar10 == 'm') && (pcVar10[1] == 't')) && (pcVar10[2] == 'd')) {
            pcVar10 = "/dev/mtd/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"sound",5);
          if (iVar5 == 0) {
            pcVar10 = "/dev/snd/";
            goto LAB_00107a32;
          }
          iVar5 = strncmp(pcVar10,"misc",4);
          if (iVar5 == 0) {
            iVar5 = strncmp(local_4d0,"log_",4);
            pcVar10 = "/dev/";
            if (iVar5 == 0) {
              pcVar10 = "/dev/log/";
              mkdir("/dev/log/",0x1ed);
              local_4d0 = pcVar12 + 5;
            }
          }
          else {
            pcVar10 = "/dev/";
          }
        }
        snprintf(local_498,0x60,"%s%s",pcVar10,local_4d0);
        pcVar12 = uevent.action;
        iVar5 = strcmp(uevent.action,"add");
        if (iVar5 == 0) {
          if ((uint)(iVar2 | iVar4) < 0x100) {
            iVar5 = get_device_perm_inner(qemu_perms,local_498,&uid,&local_4e0,&perm);
            if ((iVar5 == 0) ||
               (iVar5 = get_device_perm_inner(devperms,local_498,&uid,&local_4e0,&perm), iVar5 == 0)
               ) {
              iVar5 = (int)local_4d8;
              uVar3 = perm;
            }
            else {
              plVar14 = &devperms_partners;
              iVar5 = (int)local_4d8;
              do {
                plVar14 = plVar14->next;
                if (plVar14 == &devperms_partners) {
                  uid = 0;
                  local_4e0 = 0;
                  uVar3 = 0x180;
                  goto LAB_00107b85;
                }
                __s2 = plVar14[-2].prev;
                if (*(short *)((long)&plVar14[-1].prev + 4) == 0) {
                  iVar6 = strcmp(local_498,(char *)__s2);
                }
                else {
                  sVar9 = strlen((char *)__s2);
                  iVar6 = strncmp(local_498,(char *)__s2,sVar9);
                }
              } while (iVar6 != 0);
              uid = *(uint *)((long)&plVar14[-1].next + 4);
              local_4e0 = *(uint *)&plVar14[-1].prev;
              uVar3 = *(uint *)&plVar14[-1].next;
            }
LAB_00107b85:
            mknod(local_498,(uint)(iVar5 == 0) << 0xe | uVar3 | 0x2000,
                  (ulong)(uint)(iVar2 | iVar4 << 8));
            chown(local_498,uid,local_4e0);
          }
        }
        else {
          iVar4 = strcmp(pcVar12,"remove");
          if (iVar4 == 0) {
            unlink(local_498);
          }
        }
      }
    }
    iVar4 = strcmp(uevent.subsystem,"firmware");
    fd = local_4c4;
    if (((iVar4 == 0) && (iVar4 = strcmp(uevent.action,"add"), iVar4 == 0)) &&
       (_Var7 = fork(), _Var7 == 0)) {
      process_firmware_event(&uevent);
      exit(0);
    }
  } while( true );
}

Assistant:

void handle_device_fd(int fd)
{
    char msg[UEVENT_MSG_LEN+2];
    int n;

    while((n = recv(fd, msg, UEVENT_MSG_LEN, 0)) > 0) {
        struct uevent uevent;

        if(n == UEVENT_MSG_LEN)   /* overflow -- discard */
            continue;

        msg[n] = '\0';
        msg[n+1] = '\0';

        parse_event(msg, &uevent);

        handle_device_event(&uevent);
        handle_firmware_event(&uevent);
    }
}